

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cwrapper.cpp
# Opt level: O0

ws_match_res *
wassersteinMatch(void *tabulator1,void *tabulator2,double flow_dist,double other_scale)

{
  __tuple_element_t<0UL,_tuple<double,_double,_double>_> *p_Var1;
  __tuple_element_t<1UL,_tuple<double,_double,_double>_> *p_Var2;
  __tuple_element_t<2UL,_tuple<double,_double,_double>_> *p_Var3;
  ws_match_res *in_RDI;
  ws_match_res *res;
  tuple<double,_double,_double> tuple;
  FixedEnvelope *in_stack_00000048;
  
  IsoSpec::FixedEnvelope::WassersteinMatch
            (in_stack_00000048,(FixedEnvelope *)tabulator1,(double)tabulator2,flow_dist);
  p_Var1 = std::get<0ul,double,double,double>((tuple<double,_double,_double> *)0x13193d);
  in_RDI->res1 = *p_Var1;
  p_Var2 = std::get<1ul,double,double,double>((tuple<double,_double,_double> *)0x131953);
  in_RDI->res2 = *p_Var2;
  p_Var3 = std::get<2ul,double,double,double>((tuple<double,_double,_double> *)0x13196a);
  in_RDI->flow = *p_Var3;
  return in_RDI;
}

Assistant:

struct ws_match_res wassersteinMatch(void* tabulator1, void* tabulator2, double flow_dist, double other_scale)
{
    struct ws_match_res res;
    auto tuple = reinterpret_cast<FixedEnvelope*>(tabulator1)->WassersteinMatch(*reinterpret_cast<FixedEnvelope*>(tabulator2), flow_dist, other_scale);
    res.res1 = std::get<0>(tuple);
    res.res2 = std::get<1>(tuple);
    res.flow = std::get<2>(tuple);
    return res;
}